

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall
wabt::TypeChecker::OnIf(TypeChecker *this,TypeVector *param_types,TypeVector *result_types)

{
  Result rhs;
  Type local_30;
  TypeVector *local_28;
  TypeVector *result_types_local;
  TypeVector *param_types_local;
  TypeChecker *this_local;
  Result result;
  
  local_28 = result_types;
  result_types_local = param_types;
  param_types_local = (TypeVector *)this;
  Type::Type(&local_30,I32);
  this_local._4_4_ = PopAndCheck1Type(this,local_30,"if");
  rhs = PopAndCheckSignature(this,result_types_local,"if");
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  PushLabel(this,If,result_types_local,local_28);
  PushTypes(this,result_types_local);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnIf(const TypeVector& param_types,
                         const TypeVector& result_types) {
  Result result = PopAndCheck1Type(Type::I32, "if");
  result |= PopAndCheckSignature(param_types, "if");
  PushLabel(LabelType::If, param_types, result_types);
  PushTypes(param_types);
  return result;
}